

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall
TestClass::SyncRetFunc4(TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3,CopyCounterGuy *ccg1)

{
  ulong uVar1;
  SyncRetEventAgent4<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&>
  *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  uint param2;
  SyncRetEventAgent4<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&>
  *agent;
  bool result;
  CopyCounterGuy *ccg1_local;
  uint16_t *p3_local;
  uint32_t p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent4<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&>
               *)operator_new(0x50,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                              ,0x141);
    __n = 0;
    param2 = (uint)p1;
    SyncRetEventAgent4<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&>
    ::SyncRetEventAgent4
              (this_00,this,0x10d570,(unsigned_long *)0x0,param2,(unsigned_short *)(ulong)p2,
               (CopyCounterGuy *)p3);
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,param2);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    *p1 = *p1 + 0x400;
    *p3 = *p3 + 0x100;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc4(uint64_t& p1, uint32_t p2, uint16_t& p3, CopyCounterGuy& ccg1)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent4<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &>* agent =
				jh_new SyncRetEventAgent4<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &>(this, &TestClass::SyncRetFunc4,
					p1, p2, p3, ccg1);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u) ccg1(%d)", result, p1, p2, p3, ccg1.getCount());
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u) ccg1(%d)", p1, p2, p3, ccg1.getCount());
		p1+=1024;
		p2+=512;
		p3+=256;
		return true;
	}